

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O0

Matrix * __thiscall
ScalarEstimator::getEstimate(Matrix *__return_storage_ptr__,ScalarEstimator *this,Property *p)

{
  double dVar1;
  Physical *this_00;
  ostream *poVar2;
  void *this_01;
  double dVar3;
  double dVar4;
  double local_a80;
  Matrix local_a60;
  Matrix local_960;
  Matrix local_860;
  Matrix local_760;
  int local_65c;
  undefined1 local_658 [4];
  int i;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  Physical local_598;
  Physical local_500;
  undefined1 local_461;
  string local_460;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  Physical local_3a0;
  double local_308;
  double mean;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Physical local_238;
  undefined1 local_199;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Physical local_c8;
  undefined1 local_29;
  double local_28;
  double samples;
  Property *p_local;
  ScalarEstimator *this_local;
  Matrix *a;
  
  if ((this->super_Estimator).nSamples == 0) {
    local_a80 = 1.0;
  }
  else {
    local_a80 = (double)(this->super_Estimator).nSamples;
  }
  local_28 = local_a80;
  samples = (double)p;
  p_local = (Property *)this;
  this_local = (ScalarEstimator *)__return_storage_ptr__;
  if ((*p & (this->super_Estimator).nEstimate & 1U) == 0) {
    if ((*p & (this->super_Estimator).nEstimate & 4U) == 0) {
      if ((*p & (this->super_Estimator).nEstimate & 8U) == 0) {
        if ((*p & (this->super_Estimator).nEstimate & 2U) == 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"didn\'t find property");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,"stored: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_Estimator).nEstimate);
          poVar2 = std::operator<<(poVar2,", requested: ");
          this_01 = (void *)std::ostream::operator<<(poVar2,*(int *)samples);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          Matrix::Matrix(__return_storage_ptr__);
        }
        else {
          local_461 = 0;
          Matrix::Matrix(__return_storage_ptr__,this->nDist,2);
          this_00 = (Physical *)operator_new(0x98);
          Physical::Physical(this_00);
          Physical::Physical(&local_500,this_00);
          Matrix::setPhysical(__return_storage_ptr__,0,&local_500);
          Physical::~Physical(&local_500);
          if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
            Physical::Physical(&local_598,&((this->super_Estimator).pSource)->super_Physical);
            Matrix::setPhysical(__return_storage_ptr__,&local_598);
            Physical::~Physical(&local_598);
            Parametric::getName_abi_cxx11_
                      (&local_638,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_618,"probability distribution",&local_638);
            std::operator+(&local_5f8,&local_618," (");
            Parametric::getType_abi_cxx11_
                      ((string *)local_658,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_5d8,&local_5f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_658);
            std::operator+(&local_5b8,&local_5d8,")");
            Matrix::setName(__return_storage_ptr__,&local_5b8);
            std::__cxx11::string::~string((string *)&local_5b8);
            std::__cxx11::string::~string((string *)&local_5d8);
            std::__cxx11::string::~string((string *)local_658);
            std::__cxx11::string::~string((string *)&local_5f8);
            std::__cxx11::string::~string((string *)&local_618);
            std::__cxx11::string::~string((string *)&local_638);
          }
          for (local_65c = 0; local_65c < this->nDist; local_65c = local_65c + 1) {
            dVar3 = (double)local_65c;
            dVar1 = this->dDistOffset;
            dVar4 = this->dDistScale;
            Matrix::operator[](&local_860,__return_storage_ptr__,local_65c);
            Matrix::operator[](&local_760,&local_860,0);
            Matrix::operator=(&local_760,dVar3 * dVar4 + dVar1);
            Matrix::~Matrix(&local_760);
            Matrix::~Matrix(&local_860);
            dVar4 = this->aDist[local_65c] / local_28;
            dVar1 = this->dDistScale;
            Matrix::operator[](&local_a60,__return_storage_ptr__,local_65c);
            Matrix::operator[](&local_960,&local_a60,1);
            Matrix::operator=(&local_960,dVar4 / dVar1);
            Matrix::~Matrix(&local_960);
            Matrix::~Matrix(&local_a60);
          }
        }
      }
      else {
        mean._7_1_ = 0;
        Matrix::Matrix(__return_storage_ptr__);
        local_308 = this->dOne / local_28;
        if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
          Physical::Physical(&local_3a0,&((this->super_Estimator).pSource)->super_Physical);
          Matrix::setPhysical(__return_storage_ptr__,&local_3a0);
          Physical::~Physical(&local_3a0);
          Parametric::getName_abi_cxx11_
                    (&local_440,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_420,"variance of ",&local_440);
          std::operator+(&local_400,&local_420," (");
          Parametric::getType_abi_cxx11_
                    (&local_460,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_3e0,&local_400,&local_460);
          std::operator+(&local_3c0,&local_3e0,")");
          Matrix::setName(__return_storage_ptr__,&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_440);
        }
        Matrix::operator=(__return_storage_ptr__,this->dTwo / local_28 - local_308 * local_308);
      }
    }
    else {
      local_199 = 0;
      Matrix::Matrix(__return_storage_ptr__);
      if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
        Physical::Physical(&local_238,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(__return_storage_ptr__,&local_238);
        Physical::~Physical(&local_238);
        Parametric::getName_abi_cxx11_
                  (&local_2d8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_2b8,"mean of ",&local_2d8);
        std::operator+(&local_298,&local_2b8," (");
        Parametric::getType_abi_cxx11_
                  (&local_2f8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_278,&local_298,&local_2f8);
        std::operator+(&local_258,&local_278,")");
        Matrix::setName(__return_storage_ptr__,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      Matrix::operator=(__return_storage_ptr__,this->dOne / local_28);
    }
  }
  else {
    local_29 = 0;
    Matrix::Matrix(__return_storage_ptr__);
    if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
      Physical::Physical(&local_c8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(__return_storage_ptr__,&local_c8);
      Physical::~Physical(&local_c8);
      Parametric::getName_abi_cxx11_
                (&local_178,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_158,"sample of ",&local_178);
      std::operator+(&local_138,&local_158," (");
      Parametric::getType_abi_cxx11_
                (&local_198,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_118,&local_138,&local_198);
      std::operator+(&local_f8,&local_118,")");
      Matrix::setName(__return_storage_ptr__,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    Matrix::operator=(__return_storage_ptr__,this->dSample);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix ScalarEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	
	if(p & nEstimate & EST_SAMPLE) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dSample;
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dOne / samples;
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Matrix a;
		double mean = dOne / samples;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = (dTwo/samples - mean*mean);
		return a;
	}
	else if(p & nEstimate & EST_DENS) {
		Matrix a(nDist, 2);
		a.setPhysical(0, *(new Physical()));
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("probability distribution"+ pSource->getName() + " (" + pSource->getType() + ")" );
		}
		for(int i=0; i<nDist; i++) {
			a[i][0] = (double(i) * dDistScale) + dDistOffset;
            a[i][1] = aDist[i] / samples / dDistScale;
		}
		return a;
	}
	cout << "didn't find property" << endl;
	cout << "stored: " << nEstimate << ", requested: " << p << endl;
	return Matrix();
}